

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSynth.c
# Opt level: O1

int Cec_SequentialSynthesisPart(Gia_Man_t *p,Cec_ParSeq_t *pPars)

{
  uint uVar1;
  Vec_Vec_t *pVVar2;
  Vec_Int_t *vPart;
  int *__ptr;
  int iVar3;
  uint level;
  Gia_Man_t *p_00;
  long lVar4;
  size_t __size;
  ulong uVar5;
  int level_00;
  int nCountPis;
  int *pMapBack;
  int nCountRegs;
  long local_a0;
  Gia_Man_t *local_98;
  int *local_90;
  timespec ts;
  
  pVVar2 = p->vClockDoms;
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    local_a0 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    local_a0 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  __size = (long)p->nObjs << 2;
  local_90 = (int *)malloc(__size);
  memset(local_90,0xff,__size);
  if (0 < pVVar2->nSize) {
    uVar5 = 0;
    local_98 = p;
    do {
      vPart = (Vec_Int_t *)pVVar2->pArray[uVar5];
      p_00 = Gia_ManRegCreatePart(p,vPart,&nCountPis,&nCountRegs,&pMapBack);
      if (0 < nCountPis) {
        if (pPars->fUseScorr == 0) {
          if (pPars->fUseLcorr != 0) {
            Cec_ManCorSetDefaultParams((Cec_ParCor_t *)&ts);
            goto LAB_005b1ff0;
          }
          Gia_ManSeqCleanupClasses(p_00,pPars->fConsts,pPars->fEquivs,pPars->fVerbose);
        }
        else {
          Cec_ManCorSetDefaultParams((Cec_ParCor_t *)&ts);
LAB_005b1ff0:
          p = local_98;
          Cec_ManLSCorrespondenceClasses(p_00,(Cec_ParCor_t *)&ts);
        }
        level = Gia_TransferMappedClasses(p_00,pMapBack,local_90);
        if (pPars->fVerbose != 0) {
          uVar1 = vPart->nSize;
          iVar3 = p_00->vCis->nSize;
          Abc_Print(level,
                    "%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. Cl = %5d.\n",
                    uVar5 & 0xffffffff,(ulong)uVar1,(ulong)(iVar3 - uVar1),(ulong)(uint)nCountPis,
                    (ulong)(uint)nCountRegs,
                    (ulong)(uint)(~(iVar3 + p_00->vCos->nSize) + p_00->nObjs),(ulong)level);
        }
      }
      Gia_ManStop(p_00);
      if (pMapBack != (int *)0x0) {
        free(pMapBack);
        pMapBack = (int *)0x0;
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)pVVar2->nSize);
  }
  __ptr = local_90;
  Gia_ManNormalizeEquivalences(p,local_90);
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  if (pPars->fVerbose != 0) {
    level_00 = 3;
    iVar3 = clock_gettime(3,(timespec *)&ts);
    if (iVar3 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    lVar4 = lVar4 + local_a0;
    Abc_Print(level_00,"%s =","Total time");
    Abc_Print(level_00,"%9.2f sec\n",(double)lVar4 / 1000000.0);
  }
  return 1;
}

Assistant:

int Cec_SequentialSynthesisPart( Gia_Man_t * p, Cec_ParSeq_t * pPars )
{
    int fPrintParts = 0;
    char Buffer[100];
    Gia_Man_t * pTemp;
    Vec_Ptr_t * vParts = (Vec_Ptr_t *)p->vClockDoms;
    Vec_Int_t * vPart;
    int * pMapBack, * pReprs;
    int i, nCountPis, nCountRegs;
    int nClasses;
    abctime clk = Abc_Clock();

    // save parameters
    if ( fPrintParts )
    {
        // print partitions
        Abc_Print( 1, "The following clock domains are used:\n" );
        Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
        {
            pTemp = Gia_ManRegCreatePart( p, vPart, &nCountPis, &nCountRegs, NULL );
            sprintf( Buffer, "part%03d.aig", i );
            Gia_AigerWrite( pTemp, Buffer, 0, 0 );
            Abc_Print( 1, "part%03d.aig : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d.\n", 
                i, Vec_IntSize(vPart), Gia_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Gia_ManAndNum(pTemp) );
            Gia_ManStop( pTemp );
        }
    }

    // perform sequential synthesis for clock domains
    pReprs = ABC_FALLOC( int, Gia_ManObjNum(p) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        pTemp = Gia_ManRegCreatePart( p, vPart, &nCountPis, &nCountRegs, &pMapBack );
        if ( nCountPis > 0 ) 
        {
            if ( pPars->fUseScorr )
            {
                Cec_ParCor_t CorPars, * pCorPars = &CorPars;
                Cec_ManCorSetDefaultParams( pCorPars );
                pCorPars->nBTLimit   = pPars->nBTLimit;
                pCorPars->nLevelMax  = pPars->nLevelMax;
                pCorPars->fVerbose   = pPars->fVeryVerbose;
                pCorPars->fUseCSat   = 1;
                Cec_ManLSCorrespondenceClasses( pTemp, pCorPars );
            }
            else if ( pPars->fUseLcorr )
            {
                Cec_ParCor_t CorPars, * pCorPars = &CorPars;
                Cec_ManCorSetDefaultParams( pCorPars );
                pCorPars->fLatchCorr = 1;
                pCorPars->nBTLimit   = pPars->nBTLimit;
                pCorPars->fVerbose   = pPars->fVeryVerbose;
                pCorPars->fUseCSat   = 1;
                Cec_ManLSCorrespondenceClasses( pTemp, pCorPars );
            }
            else
            {
//                pNew = Gia_ManSeqStructSweep( pTemp, pPars->fConsts, pPars->fEquivs, pPars->fVerbose );
//                Gia_ManStop( pNew );
                Gia_ManSeqCleanupClasses( pTemp, pPars->fConsts, pPars->fEquivs, pPars->fVerbose );
            }
//Abc_Print( 1, "Part equivalences = %d.\n", Gia_ManEquivCountLitsAll(pTemp) );
            nClasses = Gia_TransferMappedClasses( pTemp, pMapBack, pReprs );
            if ( pPars->fVerbose )
            {
                Abc_Print( 1, "%3d : Reg = %4d. PI = %4d. (True = %4d. Regs = %4d.) And = %5d. Cl = %5d.\n", 
                    i, Vec_IntSize(vPart), Gia_ManCiNum(pTemp)-Vec_IntSize(vPart), nCountPis, nCountRegs, Gia_ManAndNum(pTemp), nClasses );
            }
        }
        Gia_ManStop( pTemp );
        ABC_FREE( pMapBack );
    }

    // generate resulting equivalences
    Gia_ManNormalizeEquivalences( p, pReprs );
//Abc_Print( 1, "Total equivalences = %d.\n", Gia_ManEquivCountLitsAll(p) );
    ABC_FREE( pReprs );
    if ( pPars->fVerbose )
    {
        Abc_PrintTime( 1, "Total time", Abc_Clock() - clk );
    }
    return 1;
}